

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_rowcol_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  parasail_result_t *ppVar6;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  size_t size;
  int a;
  ulong uVar12;
  uint uVar13;
  int *__s;
  int local_80;
  ulong local_70;
  int *local_50;
  
  local_70 = (ulong)(uint)s2Len;
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_rowcol_scan_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sg_flags_rowcol_scan_cold_6();
  }
  else if (open < 0) {
    parasail_sg_flags_rowcol_scan_cold_5();
  }
  else if (gap < 0) {
    parasail_sg_flags_rowcol_scan_cold_4();
  }
  else {
    uVar12 = (ulong)(uint)_s1Len;
    if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sg_flags_rowcol_scan_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sg_flags_rowcol_scan_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sg_flags_rowcol_scan_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        uVar12 = (ulong)(uint)matrix->length;
      }
      a = (int)uVar12;
      ppVar6 = parasail_result_new_rowcol1(a,s2Len);
      if (ppVar6 != (parasail_result_t *)0x0) {
        ppVar6->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                       (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar6->flag |
                       0x1440202;
        ptr = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
        ptr_00 = parasail_memalign_int(0x10,(long)(a + 1));
        size = (size_t)a;
        ptr_01 = parasail_memalign_int(0x10,size);
        ptr_02 = parasail_memalign_int(0x10,(long)(a + 1));
        if (ptr_02 != (int *)0x0 &&
            ((ptr_01 != (int *)0x0 && ptr != (int *)0x0) && ptr_00 != (int *)0x0)) {
          if (matrix->type == 0) {
            local_50 = parasail_memalign_int(0x10,size);
            if (local_50 == (int *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < a) {
              piVar1 = matrix->mapper;
              uVar8 = 0;
              do {
                local_50[uVar8] = piVar1[(byte)_s1[uVar8]];
                uVar8 = uVar8 + 1;
              } while (uVar12 != uVar8);
            }
          }
          else {
            local_50 = (int *)0x0;
          }
          __s = ptr_00 + 1;
          piVar1 = matrix->mapper;
          uVar8 = 1;
          if (1 < s2Len) {
            uVar8 = (ulong)(uint)s2Len;
          }
          uVar10 = 0;
          do {
            ptr[uVar10] = piVar1[(byte)_s2[uVar10]];
            uVar10 = uVar10 + 1;
          } while (uVar8 != uVar10);
          *ptr_00 = 0;
          *ptr_02 = 0;
          if (s1_beg == 0) {
            if (0 < a) {
              iVar2 = -open;
              uVar8 = 0;
              do {
                __s[uVar8] = iVar2;
                uVar8 = uVar8 + 1;
                iVar2 = iVar2 - gap;
              } while (uVar12 != uVar8);
            }
          }
          else if (0 < a) {
            memset(__s,0,uVar12 * 4);
          }
          if (0 < a) {
            uVar8 = 0;
            do {
              ptr_01[uVar8] = -0x40000000;
              uVar8 = uVar8 + 1;
            } while (uVar12 != uVar8);
          }
          uVar3 = s2Len - 1;
          iVar2 = -0x40000000;
          local_80 = a;
          if (s2Len != 1) {
            iVar5 = a + -1;
            uVar8 = 1;
            if (1 < (int)uVar3) {
              uVar8 = (ulong)uVar3;
            }
            iVar2 = -0x40000000;
            uVar10 = 0;
            do {
              if (0 < a) {
                uVar7 = 0;
                do {
                  iVar11 = __s[uVar7] - open;
                  if (__s[uVar7] - open < ptr_01[uVar7] - gap) {
                    iVar11 = ptr_01[uVar7] - gap;
                  }
                  ptr_01[uVar7] = iVar11;
                  uVar7 = uVar7 + 1;
                } while (uVar12 != uVar7);
              }
              if (0 < a) {
                piVar1 = matrix->matrix;
                uVar7 = 0;
                do {
                  if (matrix->type == 0) {
                    iVar11 = local_50[uVar7] * matrix->size;
                  }
                  else {
                    iVar11 = matrix->size * (int)uVar7;
                  }
                  iVar11 = ptr_00[uVar7] + piVar1[(long)iVar11 + (long)ptr[uVar10]];
                  if (iVar11 <= ptr_01[uVar7]) {
                    iVar11 = ptr_01[uVar7];
                  }
                  ptr_02[uVar7 + 1] = iVar11;
                  uVar7 = uVar7 + 1;
                } while (uVar12 != uVar7);
              }
              iVar11 = -((int)uVar10 * gap + open);
              if (s2_beg != 0) {
                iVar11 = 0;
              }
              *ptr_02 = iVar11;
              if (0 < a) {
                iVar4 = -0x40000000;
                uVar7 = 0;
                do {
                  iVar4 = iVar4 - gap;
                  if (iVar4 < ptr_02[uVar7]) {
                    iVar4 = ptr_02[uVar7];
                  }
                  iVar9 = iVar4 - open;
                  if (iVar4 - open < ptr_02[uVar7 + 1]) {
                    iVar9 = ptr_02[uVar7 + 1];
                  }
                  __s[uVar7] = iVar9;
                  uVar7 = uVar7 + 1;
                } while (uVar12 != uVar7);
              }
              *ptr_00 = iVar11;
              ((ppVar6->field_4).rowcols)->score_row[uVar10] = ptr_00[(long)iVar5 + 1];
              if ((s2_end != 0) && (iVar2 < __s[iVar5])) {
                local_70 = uVar10 & 0xffffffff;
                iVar2 = __s[iVar5];
                local_80 = iVar5;
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar8);
          }
          if (0 < a) {
            uVar8 = 0;
            do {
              iVar5 = __s[uVar8] - open;
              if (__s[uVar8] - open < ptr_01[uVar8] - gap) {
                iVar5 = ptr_01[uVar8] - gap;
              }
              ptr_01[uVar8] = iVar5;
              uVar8 = uVar8 + 1;
            } while (uVar12 != uVar8);
          }
          uVar13 = (uint)local_70;
          if (0 < a) {
            piVar1 = matrix->matrix;
            uVar8 = 0;
            do {
              if (matrix->type == 0) {
                iVar5 = local_50[uVar8] * matrix->size;
              }
              else {
                iVar5 = matrix->size * (int)uVar8;
              }
              iVar5 = ptr_00[uVar8] + piVar1[(long)iVar5 + (long)ptr[uVar3]];
              if (iVar5 <= ptr_01[uVar8]) {
                iVar5 = ptr_01[uVar8];
              }
              ptr_02[uVar8 + 1] = iVar5;
              uVar8 = uVar8 + 1;
            } while (uVar12 != uVar8);
          }
          iVar5 = 0;
          if (s2_beg == 0) {
            iVar5 = -(uVar3 * gap + open);
          }
          *ptr_02 = iVar5;
          if (0 < a) {
            iVar5 = -0x40000000;
            uVar8 = 0;
            do {
              iVar5 = iVar5 - gap;
              if (iVar5 < ptr_02[uVar8]) {
                iVar5 = ptr_02[uVar8];
              }
              iVar11 = iVar5 - open;
              if (iVar5 - open < ptr_02[uVar8 + 1]) {
                iVar11 = ptr_02[uVar8 + 1];
              }
              __s[uVar8] = iVar11;
              ((ppVar6->field_4).rowcols)->score_col[uVar8] = iVar11;
              if ((s1_end != 0) && (iVar2 < __s[uVar8])) {
                local_80 = (int)uVar8;
                local_70 = (ulong)uVar3;
                iVar2 = __s[uVar8];
              }
              uVar13 = (uint)local_70;
              uVar8 = uVar8 + 1;
            } while (uVar12 != uVar8);
          }
          ((ppVar6->field_4).rowcols)->score_row[uVar3] = ptr_00[size];
          if ((s2_end != 0) && (iVar2 < __s[size - 1])) {
            iVar2 = __s[size - 1];
            local_80 = a + -1;
            uVar13 = uVar3;
          }
          if (s2_end == 0 && s1_end == 0) {
            iVar2 = __s[size - 1];
            local_80 = a + -1;
            uVar13 = uVar3;
          }
          ppVar6->score = iVar2;
          ppVar6->end_query = local_80;
          ppVar6->end_ref = uVar13;
          parasail_free(ptr_02);
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_50);
            return ppVar6;
          }
          return ppVar6;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict E = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len-1; ++j) {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            H[i] = MAX(Ht[i], Ft_opn);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    j = s2Len - 1;
    {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            H[i] = MAX(Ht[i], Ft_opn);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
#ifdef PARASAIL_ROWCOL
            result->rowcols->score_col[i] = H[i];
#endif
            if (s1_end && H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
    }
    if (s2_end && H[s1Len-1] > score) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}